

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0_ia32aes_b.h
# Opt level: O0

uint64_t t1ha0_ia32aes_avx2(void *data,size_t len,uint64_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 (*pauVar7) [16];
  sbyte sVar8;
  undefined1 (*pauVar9) [16];
  ulong in_RDX;
  ulong in_RSI;
  undefined1 (*in_RDI) [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint64_t b;
  uint64_t a;
  uint64_t h_3;
  uint64_t h_2;
  uint64_t h_1;
  uint64_t h;
  uint shift;
  uint offset;
  uint8_t *p;
  uint64_t y_1;
  uint64_t x_1;
  __uint128_t r;
  __uint128_t r_1;
  __uint128_t r_2;
  __uint128_t r_3;
  uint64_t h_4;
  uint64_t l;
  __uint128_t r_4;
  undefined1 (*local_640) [16];
  undefined1 local_608 [16];
  undefined1 (*local_5f0) [16];
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [16];
  ulong local_5c0;
  ulong local_5b8;
  ulong local_5a8;
  undefined1 (*local_5a0) [16];
  ulong local_160;
  ulong local_128;
  long local_120;
  ulong local_f8;
  long local_f0;
  ulong local_c8;
  long local_c0;
  ulong local_98;
  long local_90;
  uint64_t *v;
  __m128i v1x;
  __m128i v0y;
  __m128i t;
  __m128i salt;
  __m128i *detent;
  __m128i *v_1;
  __m128i y;
  __m128i x;
  
  local_5c0 = in_RSI;
  local_5b8 = in_RDX;
  local_5a8 = in_RSI;
  local_5a0 = in_RDI;
  if (0x20 < in_RSI) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = in_RSI;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = in_RDX;
    local_5d8 = vpunpcklqdq_avx(auVar10,auVar11);
    auVar10 = vpunpcklqdq_avx(ZEXT816(0x82434fe90edcef39),ZEXT816(0xec99bf0d8372caab));
    local_5e8 = aesenc(local_5d8,auVar10);
    local_5a0 = (undefined1 (*) [16])(*in_RDI + (in_RSI & 0xfffffffffffffff0));
    local_5f0 = in_RDI;
    if ((in_RSI & 0x10) != 0) {
      local_5f0 = in_RDI + 1;
      local_5d8 = vpaddq_avx(local_5d8,*in_RDI);
      local_5e8 = aesenc(local_5d8,local_5e8);
    }
    local_5a8 = in_RSI & 0xf;
    if (local_5f0 + 7 < local_5a0) {
      local_608 = local_5e8;
      do {
        auVar10 = aesenc(*local_5f0,local_608);
        auVar10 = aesdec(auVar10,local_5f0[1]);
        auVar10 = aesdec(auVar10,local_5f0[2]);
        auVar10 = aesdec(auVar10,local_5f0[3]);
        auVar10 = aesdec(auVar10,local_5f0[4]);
        auVar10 = aesdec(auVar10,local_5f0[5]);
        auVar10 = aesdec(auVar10,local_5f0[6]);
        pauVar9 = local_5f0 + 8;
        auVar11 = aesdec(auVar10,local_5f0[7]);
        auVar10 = vpunpcklqdq_avx(ZEXT816(0xcb5af53ae3aaac31),ZEXT816(0xc060724a8424f345));
        local_608 = vpaddq_avx(local_608,auVar10);
        auVar10 = aesenc(local_5d8,auVar11);
        local_5d8 = vpaddq_avx(local_5e8,local_5d8);
        pauVar7 = local_5f0 + 0xf;
        local_5f0 = pauVar9;
        local_5e8 = auVar10;
      } while (pauVar7 < local_5a0);
    }
    while (local_5f0 < local_5a0) {
      auVar10 = vpaddq_avx(local_5e8,*local_5f0);
      auVar11 = vpsubq_avx(local_5d8,local_5f0[1]);
      local_5d8 = aesdec(local_5d8,auVar10);
      local_5e8 = aesdec(local_5e8,auVar11);
      local_5f0 = local_5f0 + 2;
    }
    auVar10 = aesenc(local_5e8,local_5d8);
    auVar10 = aesdec(local_5d8,auVar10);
    auVar10 = vpaddq_avx(auVar10,local_5e8);
    local_5d8._0_8_ = auVar10._0_8_;
    local_5b8 = local_5d8._0_8_;
    local_5d8._8_8_ = auVar10._8_8_;
    local_5c0 = local_5d8._8_8_;
  }
  local_640 = local_5a0;
  switch(local_5a8) {
  default:
    local_640 = (undefined1 (*) [16])(*local_5a0 + 8);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_5c0 + *(long *)*local_5a0;
    local_120 = SUB168(auVar1 * ZEXT816(0x9c06faf4d023e3ab),8);
    local_128 = SUB168(auVar1 * ZEXT816(0x9c06faf4d023e3ab),0);
    local_5b8 = local_128 ^ local_5b8;
    local_5c0 = local_120 + local_5c0;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_5b8 + *(long *)*local_640;
    local_f0 = SUB168(auVar2 * ZEXT816(0xbd9cacc22c6e9571),8);
    local_f8 = SUB168(auVar2 * ZEXT816(0xbd9cacc22c6e9571),0);
    local_5c0 = local_f8 ^ local_5c0;
    local_5b8 = local_f0 + local_5b8;
    local_640 = (undefined1 (*) [16])(*local_640 + 8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_5c0 + *(long *)*local_640;
    local_c0 = SUB168(auVar3 * ZEXT816(0xd4f06db99d67be4b),8);
    local_c8 = SUB168(auVar3 * ZEXT816(0xd4f06db99d67be4b),0);
    local_5b8 = local_c8 ^ local_5b8;
    local_5c0 = local_c0 + local_5c0;
    local_640 = (undefined1 (*) [16])(*local_640 + 8);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar6 = 8U - (int)local_5a8 & 7;
    sVar8 = (sbyte)(uVar6 << 3);
    if (((ulong)local_640 & 0xff8) == 0) {
      local_160 = *(ulong *)*local_640 & 0xffffffffffffffffU >> sVar8;
    }
    else {
      local_160 = *(ulong *)((long)local_640 - (ulong)uVar6) >> sVar8;
    }
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_5b8 + local_160;
    local_90 = SUB168(auVar4 * ZEXT816(0x82434fe90edcef39),8);
    local_98 = SUB168(auVar4 * ZEXT816(0x82434fe90edcef39),0);
    local_5c0 = local_98 ^ local_5c0;
    local_5b8 = local_90 + local_5b8;
  case 0:
    auVar5._8_8_ = 0;
    auVar5._0_8_ = (local_5b8 + (local_5c0 >> 0x29 | local_5c0 << 0x17)) * -0x136640f27c8d3555 ^
                   ((local_5b8 >> 0x17 | local_5b8 << 0x29) + local_5c0) * -0x34a50ac51c5553cf;
    y[0] = SUB168(auVar5 * ZEXT816(0xc060724a8424f345),8);
    v_1 = SUB168(auVar5 * ZEXT816(0xc060724a8424f345),0);
    return (ulong)v_1 ^ y[0];
  }
}

Assistant:

uint64_t T1HA_IA32AES_NAME(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(prime_0, prime_1));

    const __m128i *v = (const __m128i *)data;
    const __m128i *const detent =
        (const __m128i *)((const uint8_t *)data + (len & ~15ul));
    data = detent;

    if (len & 16) {
      x = _mm_add_epi64(x, _mm_loadu_si128(v++));
      y = _mm_aesenc_si128(x, y);
    }
    len &= 15;

    if (v + 7 < detent) {
      __m128i salt = y;
      do {
        __m128i t = _mm_aesenc_si128(_mm_loadu_si128(v++), salt);
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));
        t = _mm_aesdec_si128(t, _mm_loadu_si128(v++));

        salt = _mm_add_epi64(salt, _mm_set_epi64x(prime_5, prime_6));
        t = _mm_aesenc_si128(x, t);
        x = _mm_add_epi64(y, x);
        y = t;
      } while (v + 7 < detent);
    }

    while (v < detent) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
#if defined(__SSE4_1__) || defined(__AVX__)
    a = _mm_extract_epi64(x, 0);
    b = _mm_extract_epi64(x, 1);
#else
    a = _mm_cvtsi128_si64(x);
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
#if defined(__SSE4_1__) || defined(__AVX__)
    a = (uint32_t)_mm_extract_epi32(x, 0) | (uint64_t)_mm_extract_epi32(x, 1)
                                                << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) | (uint64_t)_mm_extract_epi32(x, 3)
                                                << 32;
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
#ifdef __AVX__
    _mm256_zeroall();
#elif !(defined(_X86_64_) || defined(__x86_64__) || defined(_M_X64))
    _mm_empty();
#endif
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_4);
  /* fall through */
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    mixup64(&b, &a, fetch64_le_unaligned(v++), prime_3);
  /* fall through */
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_2);
  /* fall through */
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    mixup64(&b, &a, tail64_le_unaligned(v, len), prime_1);
  /* fall through */
  case 0:
    return final64(a, b);
  }
}